

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

Status __thiscall HighsMipSolverData::evaluateRootLp(HighsMipSolverData *this)

{
  HighsDomain *this_00;
  double dVar1;
  StabilizerOrbits *this_01;
  long lVar2;
  HighsMipSolver *pHVar3;
  bool bVar4;
  Status SVar5;
  Status unaff_EBP;
  bool bVar6;
  double dVar7;
  double dVar8;
  
  this_00 = &this->domain;
  do {
    HighsDomain::propagate(this_00);
    this_01 = (this->globalOrbits).
              super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((this_01 != (StabilizerOrbits *)0x0) && ((this->domain).infeasible_ == false)) {
      StabilizerOrbits::orbitalFixing(this_01,this_00);
    }
    if ((this->domain).infeasible_ == true) {
      dVar1 = this->upper_bound;
      dVar7 = dVar1;
      if (dVar1 == INFINITY) {
        dVar7 = INFINITY;
      }
      dVar8 = this->lower_bound;
      this->lower_bound = dVar7;
      if (this->mipsolver->submip == false) {
        if ((dVar7 != dVar8) || (NAN(dVar7) || NAN(dVar8))) {
          updatePrimalDualIntegral(this,dVar8,dVar7,dVar1,dVar1,false,false);
        }
      }
      (this->pruned_treeweight).hi = 1.0;
      (this->pruned_treeweight).lo = 0.0;
      this->num_nodes = this->num_nodes + 1;
      this->num_leaves = this->num_leaves + 1;
      return kInfeasible;
    }
    if ((this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if ((this->lp).lpsolver.model_status_ == kMin) goto LAB_002c0721;
      SVar5 = (this->lp).status;
      bVar6 = false;
LAB_002c086e:
      if (SVar5 == kInfeasible) {
        dVar1 = this->upper_bound;
        dVar7 = dVar1;
        if (dVar1 == INFINITY) {
          dVar7 = INFINITY;
        }
        dVar8 = this->lower_bound;
        this->lower_bound = dVar7;
        if (this->mipsolver->submip == false) {
          if ((dVar7 != dVar8) || (NAN(dVar7) || NAN(dVar8))) {
            updatePrimalDualIntegral(this,dVar8,dVar7,dVar1,dVar1,false,false);
          }
        }
LAB_002c0980:
        (this->pruned_treeweight).hi = 1.0;
        (this->pruned_treeweight).lo = 0.0;
        this->num_nodes = this->num_nodes + 1;
        this->num_leaves = this->num_leaves + 1;
        unaff_EBP = kInfeasible;
        goto LAB_002c09ac;
      }
      if (((this->lp).status - kOptimal & 0xfffffffd) == 0) {
        dVar1 = this->lower_bound;
        dVar7 = (this->lp).objective;
        dVar8 = dVar1;
        if (dVar1 <= dVar7) {
          dVar8 = dVar7;
        }
        this->lower_bound = dVar8;
        if (this->mipsolver->submip == false) {
          if ((dVar8 != dVar1) || (NAN(dVar8) || NAN(dVar1))) {
            updatePrimalDualIntegral
                      (this,dVar1,dVar8,this->upper_bound,this->upper_bound,false,false);
          }
        }
        if ((bVar6) &&
           (HighsRedcostFixing::addRootRedcost
                      (&this->redcostfixing,this->mipsolver,&(this->lp).lpsolver.solution_.col_dual,
                       (this->lp).objective), this->upper_limit < INFINITY)) {
          HighsRedcostFixing::propagateRootRedcost(&this->redcostfixing,this->mipsolver);
        }
      }
      if (this->optimality_limit <= this->lower_bound && this->lower_bound != this->optimality_limit
         ) goto LAB_002c0980;
      bVar6 = (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
      if (!bVar6) {
        unaff_EBP = SVar5;
      }
    }
    else {
      removeFixedIndices(this);
      HighsLpRelaxation::flushDomain(&this->lp,this_00,false);
LAB_002c0721:
      lVar2 = (this->lp).numlpiters;
      SVar5 = HighsLpRelaxation::resolveLp(&this->lp,this_00);
      this->total_lp_iterations = this->total_lp_iterations + ((this->lp).numlpiters - lVar2);
      this->avgrootlpiters = (this->lp).avgSolveIters;
      bVar6 = true;
      if (SVar5 == kOptimal) {
        if (((this->lp).fractionalints.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start ==
             (this->lp).fractionalints.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish) &&
           (bVar4 = addIncumbent(this,&(this->lp).lpsolver.solution_.col_value,(this->lp).objective,
                                 8,true,false), bVar4)) {
          pHVar3 = this->mipsolver;
          pHVar3->modelstatus_ = kOptimal;
          dVar1 = this->lower_bound;
          dVar7 = this->upper_bound;
          this->lower_bound = dVar7;
          unaff_EBP = kInfeasible;
          if (pHVar3->submip == false) {
            if ((dVar7 != dVar1) || (NAN(dVar7) || NAN(dVar1))) {
              updatePrimalDualIntegral(this,dVar1,dVar7,dVar7,dVar7,false,false);
            }
          }
          goto LAB_002c0785;
        }
      }
      else if (SVar5 == kUnbounded) {
        pHVar3 = this->mipsolver;
        pHVar3->modelstatus_ =
             ((pHVar3->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start !=
             (pHVar3->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish) + kUnboundedOrInfeasible;
        unaff_EBP = kUnbounded;
LAB_002c0785:
        (this->pruned_treeweight).hi = 1.0;
        (this->pruned_treeweight).lo = 0.0;
        this->num_nodes = this->num_nodes + 1;
        this->num_leaves = this->num_leaves + 1;
        bVar6 = false;
      }
      if (bVar6) {
        bVar6 = true;
        goto LAB_002c086e;
      }
LAB_002c09ac:
      bVar6 = false;
    }
    if (!bVar6) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

HighsLpRelaxation::Status HighsMipSolverData::evaluateRootLp() {
  do {
    domain.propagate();

    if (globalOrbits && !domain.infeasible())
      globalOrbits->orbitalFixing(domain);

    if (domain.infeasible()) {
      double prev_lower_bound = lower_bound;

      lower_bound = std::min(kHighsInf, upper_bound);

      bool bound_change = lower_bound != prev_lower_bound;
      if (!mipsolver.submip && bound_change)
        updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                                 upper_bound);
      pruned_treeweight = 1.0;
      num_nodes += 1;
      num_leaves += 1;
      return HighsLpRelaxation::Status::kInfeasible;
    }

    bool lpBoundsChanged = false;
    if (!domain.getChangedCols().empty()) {
      lpBoundsChanged = true;
      removeFixedIndices();
      lp.flushDomain(domain);
    }

    bool lpWasSolved = false;
    HighsLpRelaxation::Status status;
    if (lpBoundsChanged ||
        lp.getLpSolver().getModelStatus() == HighsModelStatus::kNotset) {
      int64_t lpIters = -lp.getNumLpIterations();
      status = lp.resolveLp(&domain);
      lpIters += lp.getNumLpIterations();
      total_lp_iterations += lpIters;
      avgrootlpiters = lp.getAvgSolveIters();
      lpWasSolved = true;

      if (status == HighsLpRelaxation::Status::kUnbounded) {
        if (mipsolver.solution_.empty())
          mipsolver.modelstatus_ = HighsModelStatus::kUnboundedOrInfeasible;
        else
          mipsolver.modelstatus_ = HighsModelStatus::kUnbounded;

        pruned_treeweight = 1.0;
        num_nodes += 1;
        num_leaves += 1;
        return status;
      }

      if (status == HighsLpRelaxation::Status::kOptimal &&
          lp.getFractionalIntegers().empty() &&
          addIncumbent(lp.getLpSolver().getSolution().col_value,
                       lp.getObjective(), kSolutionSourceEvaluateNode)) {
        mipsolver.modelstatus_ = HighsModelStatus::kOptimal;

        double prev_lower_bound = lower_bound;

        lower_bound = upper_bound;

        bool bound_change = lower_bound != prev_lower_bound;
        if (!mipsolver.submip && bound_change)
          updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                                   upper_bound);
        pruned_treeweight = 1.0;
        num_nodes += 1;
        num_leaves += 1;
        return HighsLpRelaxation::Status::kInfeasible;
      }
    } else
      status = lp.getStatus();

    if (status == HighsLpRelaxation::Status::kInfeasible) {
      double prev_lower_bound = lower_bound;

      lower_bound = std::min(kHighsInf, upper_bound);

      bool bound_change = lower_bound != prev_lower_bound;
      if (!mipsolver.submip && bound_change)
        updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                                 upper_bound);
      pruned_treeweight = 1.0;
      num_nodes += 1;
      num_leaves += 1;
      return status;
    }

    if (lp.unscaledDualFeasible(lp.getStatus())) {
      double prev_lower_bound = lower_bound;

      lower_bound = std::max(lp.getObjective(), lower_bound);

      bool bound_change = lower_bound != prev_lower_bound;
      if (!mipsolver.submip && bound_change)
        updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                                 upper_bound);

      if (lpWasSolved) {
        redcostfixing.addRootRedcost(mipsolver,
                                     lp.getLpSolver().getSolution().col_dual,
                                     lp.getObjective());
        if (upper_limit != kHighsInf)
          redcostfixing.propagateRootRedcost(mipsolver);
      }
    }

    if (lower_bound > optimality_limit) {
      pruned_treeweight = 1.0;
      num_nodes += 1;
      num_leaves += 1;
      return HighsLpRelaxation::Status::kInfeasible;
    }

    if (domain.getChangedCols().empty()) return status;
  } while (true);
}